

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::CopyingFileOutputStream
          (CopyingFileOutputStream *this,int file_descriptor)

{
  undefined4 in_ESI;
  CopyingOutputStream *in_RDI;
  
  CopyingOutputStream::CopyingOutputStream(in_RDI);
  in_RDI->_vptr_CopyingOutputStream = (_func_int **)&PTR__CopyingFileOutputStream_00960948;
  *(undefined4 *)&in_RDI[1]._vptr_CopyingOutputStream = in_ESI;
  *(undefined1 *)((long)&in_RDI[1]._vptr_CopyingOutputStream + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_CopyingOutputStream + 5) = 0;
  *(undefined4 *)&in_RDI[2]._vptr_CopyingOutputStream = 0;
  return;
}

Assistant:

FileOutputStream::CopyingFileOutputStream::CopyingFileOutputStream(
    int file_descriptor)
    : file_(file_descriptor),
      close_on_delete_(false),
      is_closed_(false),
      errno_(0) {}